

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O1

ElnDist * __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateUpperLimit
          (ElnDist *__return_storage_ptr__,ElectronOptimisationAlgorithm *this)

{
  ulong *puVar1;
  pointer __s;
  pointer puVar2;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *p_Var3;
  ElectronOptimisationAlgorithm *pEVar4;
  Score SVar5;
  const_iterator __position;
  size_type sVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar9;
  size_t mPos;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> all_pos;
  _Alloc_node local_c0;
  Score local_b4;
  unsigned_long local_b0;
  ElectronOptimisationAlgorithm *local_a8;
  ElnDist local_a0;
  ElnDist local_80;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->m_bits,&(this->previousDist_).m_bits);
  __return_storage_ptr__->m_num_bits = (this->previousDist_).m_num_bits;
  __s = (__return_storage_ptr__->m_bits).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->m_bits).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar2) {
    memset(__s,0,(long)puVar2 - (long)__s & 0xfffffffffffffff8);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__return_storage_ptr__->m_num_bits != 0) {
    __position._M_node = &local_60._M_impl.super__Rb_tree_header._M_header;
    do {
      local_c0._M_t = &local_60;
      __position._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
           ::
           _M_insert_unique_<unsigned_long_const&,std::_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>::_Alloc_node>
                     ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                       *)&local_60,__position,&local_b0,&local_c0);
      local_b0 = local_b0 + 1;
    } while (local_b0 < __return_storage_ptr__->m_num_bits);
  }
  sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (__return_storage_ptr__);
  pEVar4 = this;
  if (sVar6 < this->parent_->electronsToAdd_) {
    do {
      local_a8 = pEVar4;
      local_b4 = Options::AssignElectrons::INF;
      local_c0._M_t =
           *(_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        do {
          p_Var3 = *(_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     **)(p_Var7 + 1);
          uVar8 = 1L << ((byte)p_Var3 & 0x3f);
          puVar1 = (__return_storage_ptr__->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + ((ulong)p_Var3 >> 6);
          *puVar1 = *puVar1 | uVar8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_a0.m_bits,&__return_storage_ptr__->m_bits);
          local_a0.m_num_bits = __return_storage_ptr__->m_num_bits;
          SVar5 = CalculateDistributionEnergy(local_a8,&local_a0);
          if (local_a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (SVar5 < local_b4) {
            local_c0._M_t =
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)p_Var3;
            local_b4 = SVar5;
          }
          puVar1 = (__return_storage_ptr__->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + ((ulong)p_Var3 >> 6);
          *puVar1 = *puVar1 & ~uVar8;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header);
      }
      puVar1 = (__return_storage_ptr__->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + ((ulong)local_c0._M_t >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)local_c0._M_t & 0x3f);
      pVar9 = std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::equal_range(&local_60,(key_type *)&local_c0);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(&local_60,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
      sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                        (__return_storage_ptr__);
      this = local_a8;
      pEVar4 = local_a8;
    } while (sVar6 < local_a8->parent_->electronsToAdd_);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_80.m_bits,&__return_storage_ptr__->m_bits);
  local_80.m_num_bits = __return_storage_ptr__->m_num_bits;
  SVar5 = CalculateDistributionEnergy(this,&local_80);
  this->upperLimit_ = SVar5;
  if (local_80.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (this->upperLimit_ < Options::AssignElectrons::INF) {
    this->upperLimit_ = this->upperLimit_ + 1;
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ElnDist ElectronOptimisationAlgorithm::CalculateUpperLimit() {
//  bool tmp_allow_charged_carbon = opt_::ALLOW_CHARGED_CARBON;
//  opt_::ALLOW_CHARGED_CARBON = true;
//  uint32_t tmp_high_charge = opt_::HIGHEST_MAGNITUDE_CHARGE;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = 0;
  
  ElnDist initDist = ElnDist(previousDist_);
  initDist.reset();
  std::set<size_t> all_pos;
  std::set<size_t>::const_iterator it = all_pos.begin();
  for (size_t i = 0; i < initDist.size(); ++i) it = all_pos.insert(it, i);
  
  while (initDist.count() < parent_->electronsToAdd_) {
    Score cMin = opt_::INF;
    size_t mPos = *(all_pos.begin());
    for (size_t i : all_pos) {
      initDist.set(i);
      Score tmp = CalculateDistributionEnergy(initDist);
      if (tmp < cMin) {
        cMin = tmp;
        mPos = i;
      }
      initDist.reset(i);
    }
    initDist.set(mPos);
    all_pos.erase(mPos);
  }
  upperLimit_ = CalculateDistributionEnergy(initDist);
  
//  opt_::ALLOW_CHARGED_CARBON = tmp_allow_charged_carbon;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = tmp_high_charge;
  
  if (upperLimit_ < opt_::INF) ++upperLimit_;
  return initDist;
}